

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.h
# Opt level: O3

string * __thiscall
jaegertracing::net::URI::authority_abi_cxx11_(string *__return_storage_ptr__,URI *this)

{
  size_type *psVar1;
  uint uVar2;
  uint __val;
  undefined8 uVar3;
  uint uVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint __len;
  __string_type __str;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  ulong local_48;
  ulong local_40 [2];
  
  if (*(int *)(this + 0x40) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    return __return_storage_ptr__;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)(this + 0x20),
             *(long *)(this + 0x28) + *(long *)(this + 0x20));
  std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  uVar2 = *(uint *)(this + 0x40);
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_001b6175;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_001b6175;
      }
      if (uVar6 < 10000) goto LAB_001b6175;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_001b6175:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_70),__len,__val);
  uVar7 = 0xf;
  if (local_50 != local_40) {
    uVar7 = local_40[0];
  }
  if (uVar7 < local_68 + local_48) {
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (local_68 + local_48 <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_001b6201;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_001b6201:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string authority() const
    {
        if (_port != 0) {
            return _host + ':' + std::to_string(_port);
        }
        return _host;
    }